

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv4Transmitter::ClearAcceptIgnoreInfo(RTPUDPv4Transmitter *this)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  
  pHVar2 = (this->acceptignoreinfo).firsthashelem;
  (this->acceptignoreinfo).curhashelem = pHVar2;
  while (pHVar2 != (HashElement *)0x0) {
    RTPDelete<jrtplib::RTPUDPv4Transmitter::PortInfo>
              (pHVar2->element,(this->super_RTPTransmitter).super_RTPMemoryObject.mgr);
    pHVar1 = (this->acceptignoreinfo).curhashelem;
    pHVar2 = (HashElement *)0x0;
    if (pHVar1 != (HashElement *)0x0) {
      pHVar2 = pHVar1->listnext;
      (this->acceptignoreinfo).curhashelem = pHVar2;
    }
  }
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  ::Clear(&this->acceptignoreinfo);
  return;
}

Assistant:

void RTPUDPv4Transmitter::ClearAcceptIgnoreInfo()
{
	acceptignoreinfo.GotoFirstElement();
	while (acceptignoreinfo.HasCurrentElement())
	{
		PortInfo *inf;

		inf = acceptignoreinfo.GetCurrentElement();
		RTPDelete(inf,GetMemoryManager());
		acceptignoreinfo.GotoNextElement();
	}
	acceptignoreinfo.Clear();
}